

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Mapping.cpp
# Opt level: O0

int __thiscall axl::io::Mapping::open(Mapping *this,char *__file,int __oflag,...)

{
  uint64_t uVar1;
  Module *this_00;
  SystemInfo *pSVar2;
  int fd;
  long lVar3;
  void *pvVar4;
  undefined4 uVar5;
  size_t in_RCX;
  size_t offset;
  uint in_R8D;
  int protection;
  void *p;
  uint64_t viewEnd;
  uint64_t viewBegin;
  SystemInfo *systemInfo;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  size_t local_28;
  int local_8;
  
  close(this,(int)__file);
  local_28 = in_RCX;
  if (in_RCX == 0xffffffffffffffff) {
    uVar1 = File::getSize((File *)0x1adc41);
    local_28 = uVar1 - ___oflag;
  }
  this_00 = g::getModule();
  pSVar2 = g::Module::getSystemInfo(this_00);
  offset = ___oflag - ___oflag % pSVar2->m_mappingAlignFactor;
  uVar5 = 3;
  if ((in_R8D & 1) != 0) {
    uVar5 = 1;
  }
  fd = (int)((ulong)&this->m_mapping >> 0x20);
  lVar3 = (___oflag + local_28) - offset;
  uVar6 = uVar5;
  sl::Handle::operator_cast_to_int((Handle *)__file);
  pvVar4 = psx::Mapping::map((Mapping *)CONCAT44(uVar6,in_stack_ffffffffffffffa8),this,
                             CONCAT44(uVar5,in_stack_ffffffffffffff98),(int)((ulong)lVar3 >> 0x20),
                             (uint_t)lVar3,fd,offset);
  if (pvVar4 == (void *)0x0) {
    local_8 = 0;
  }
  else {
    this->m_p = (void *)((long)pvVar4 + (___oflag - offset));
    this->m_size = local_28;
    local_8 = (int)this->m_p;
  }
  return local_8;
}

Assistant:

void*
Mapping::open(
	File* file,
	uint64_t offset,
	size_t size,
	uint_t flags
) {
	close();

	if (size == -1)
		size = (size_t)(file->getSize() - offset);

	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	uint64_t viewBegin = offset - offset % systemInfo->m_mappingAlignFactor;
	uint64_t viewEnd = offset + size;

	void* p;

#if (_AXL_OS_WIN)
	uint_t protection = (flags & FileFlag_ReadOnly) ? PAGE_READONLY : PAGE_READWRITE;
	uint_t access = (flags & FileFlag_ReadOnly) ? FILE_MAP_READ : FILE_MAP_READ | FILE_MAP_WRITE;

	bool result = m_mapping.create(file->m_file, NULL, protection, viewEnd);
	if (!result)
		return NULL;

	p = m_view.view(m_mapping, access, viewBegin, (size_t)(viewEnd - viewBegin));
	if (!p) {
		m_mapping.close();
		return NULL;
	}
#elif (_AXL_OS_POSIX)
	int protection = (flags & FileFlag_ReadOnly) ? PROT_READ : PROT_READ | PROT_WRITE;

	p = m_mapping.map(NULL, viewEnd - viewBegin, protection, MAP_SHARED, file->m_file, viewBegin);
	if (!p)
		return NULL;
#endif

	m_p = (char*)p + offset - viewBegin;
	m_size = size;
	return m_p;
}